

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O2

QString * __thiscall QString::left(QString *__return_storage_ptr__,QString *this,qsizetype n)

{
  if ((ulong)n < (ulong)(this->d).size) {
    QString(__return_storage_ptr__,(QChar *)(this->d).ptr,n);
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&this->d);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::left(qsizetype n) const
{
    if (size_t(n) >= size_t(size()))
        return *this;
    return QString((const QChar*) d.data(), n);
}